

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

void __thiscall
despot::BaseTag::MostLikelyRobPosition
          (BaseTag *this,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles)

{
  pointer ppSVar1;
  pointer ppSVar2;
  pointer piVar3;
  State *pSVar4;
  pointer pdVar5;
  pointer pdVar6;
  int iVar7;
  int i_1;
  long lVar8;
  int i;
  long lVar9;
  double dVar10;
  double dVar11;
  allocator_type local_11;
  
  if ((MostLikelyRobPosition(std::vector<despot::State*,std::allocator<despot::State*>>const&)::
       probs == '\0') &&
     (iVar7 = __cxa_guard_acquire(&MostLikelyRobPosition(std::vector<despot::State*,std::allocator<despot::State*>>const&)
                                   ::probs), iVar7 != 0)) {
    iVar7 = despot::Floor::NumCells();
    std::vector<double,_std::allocator<double>_>::vector
              (&MostLikelyRobPosition::probs,(long)iVar7,&local_11);
    __cxa_atexit(std::vector<double,_std::allocator<double>_>::~vector,&MostLikelyRobPosition::probs
                 ,&__dso_handle);
    __cxa_guard_release(&MostLikelyRobPosition(std::vector<despot::State*,std::allocator<despot::State*>>const&)
                         ::probs);
  }
  pdVar5 = MostLikelyRobPosition::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppSVar1 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppSVar2 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  piVar3 = (this->rob_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar10 = 0.0;
  for (lVar9 = 0;
      pdVar6 = MostLikelyRobPosition::probs.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start, (long)ppSVar2 - (long)ppSVar1 >> 3 != lVar9
      ; lVar9 = lVar9 + 1) {
    pSVar4 = ppSVar1[lVar9];
    iVar7 = piVar3[*(int *)(pSVar4 + 0xc)];
    dVar11 = *(double *)(pSVar4 + 0x18) + pdVar5[iVar7];
    pdVar5[iVar7] = dVar11;
    if (dVar11 <= dVar10) {
      dVar11 = dVar10;
    }
    dVar10 = dVar11;
  }
  lVar9 = (long)MostLikelyRobPosition::probs.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)MostLikelyRobPosition::probs.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
  for (lVar8 = 0; lVar9 >> 3 != lVar8; lVar8 = lVar8 + 1) {
    pdVar6[lVar8] = 0.0;
  }
  despot::Floor::GetCell((int)this + 0x58);
  return;
}

Assistant:

Coord BaseTag::MostLikelyRobPosition(const vector<State*>& particles) const {
	static vector<double> probs = vector<double>(floor_.NumCells());

	double maxWeight = 0;
	int rob = -1;
	for (int i = 0; i < particles.size(); i++) {
		TagState* tagstate = static_cast<TagState*>(particles[i]);
		int id = rob_[tagstate->state_id];
		probs[id] += tagstate->weight;

		if (probs[id] > maxWeight) {
			maxWeight = probs[id];
			rob = id;
		}
	}

	for (int i = 0; i < probs.size(); i++) {
		probs[i] = 0.0;
	}

	return floor_.GetCell(rob);
}